

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O0

RDL_graph * RDL_initNewGraph_g(uint V,char owns_edges)

{
  RDL_graph *gra;
  uint *degree_00;
  uint local_24;
  uint i;
  uint *degree;
  RDL_graph *graph;
  char owns_edges_local;
  uint V_local;
  
  gra = (RDL_graph *)malloc(0x28);
  degree_00 = (uint *)malloc((ulong)V << 2);
  for (local_24 = 0; local_24 < V; local_24 = local_24 + 1) {
    degree_00[local_24] = 0;
  }
  RDL_initGraph(gra,V,degree_00,owns_edges);
  return gra;
}

Assistant:

RDL_graph *RDL_initNewGraph_g(unsigned V, char owns_edges)
{
  RDL_graph *graph = malloc(sizeof(*graph));
  unsigned *degree;
  unsigned i;
  degree = malloc(V * sizeof(*degree));
  for(i=0; i<V; ++i)
  {
    degree[i] = 0;
  }
  RDL_initGraph(graph,V,degree,owns_edges);

  return graph;
}